

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

uint FIX::IntTConvertor<unsigned_int>::convert(string *value)

{
  const_iterator str;
  bool bVar1;
  uint in_EAX;
  FieldConvertError *this;
  uint result;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  str._M_current = (value->_M_dataplus)._M_p;
  bVar1 = convert(str,(const_iterator)(str._M_current + value->_M_string_length),
                  (uint *)((long)&uStack_18 + 4));
  if (bVar1) {
    return uStack_18._4_4_;
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    T result = 0;
    if (!convert(value.begin(), value.end(), result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }